

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<16,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar10;
  undefined4 uVar11;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_108 [6];
  float local_f0 [2];
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  Matrix<float,_4,_3> local_a8;
  Matrix<float,_4,_3> local_78;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_2c;
  undefined4 local_24;
  undefined4 local_20;
  undefined8 local_18;
  long lVar9;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_78.m_data.m_data + 1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar7 = _DAT_019fcc00;
      do {
        bVar10 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar6) =
               uVar11;
        }
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar6) = uVar11;
        }
        lVar9 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar5 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_78;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_a8.m_data.m_data + 1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar8 = _DAT_019fcc00;
      do {
        bVar10 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar6) =
               uVar11;
        }
        if (bVar10) {
          uVar11 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar11 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar6) = uVar11;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar5 != 4);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_a8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_a8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_a8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_a8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_a8;
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    local_a8.m_data.m_data[2].m_data[2] = 0.0;
    local_a8.m_data.m_data[2].m_data[3] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[3] = 0.0;
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_01bf45c0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  tcu::operator-(&local_78,&local_a8);
  local_b8 = local_40;
  local_b0 = local_38;
  local_c8 = local_2c;
  local_c0 = local_24;
  local_f0[0] = 0.0;
  local_f0[1] = 0.0;
  local_e8 = (ulong)local_e8._4_4_ << 0x20;
  lVar3 = 0;
  do {
    local_f0[lVar3] =
         *(float *)((long)&local_b8 + lVar3 * 4) + *(float *)((long)&local_c8 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_d8 = local_18;
  local_d0 = local_20;
  afStack_108[2] = 0.0;
  afStack_108[3] = 0.0;
  afStack_108[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_108[lVar3 + 2] = local_f0[lVar3] + *(float *)((long)&local_d8 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e8 = 0x100000000;
  local_e0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_f0[lVar3]] = afStack_108[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}